

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall
GlobOpt::OptConstPeep(GlobOpt *this,Instr *instr,Opnd *constSrc,Value **pDstVal,ValueInfo *valuInfo)

{
  OpCode OVar1;
  code *pcVar2;
  Opnd *pOVar3;
  bool bVar4;
  OpndKind OVar5;
  OpndKind OVar6;
  byte bVar7;
  uint uVar8;
  undefined4 *puVar9;
  Opnd *pOVar10;
  char *message;
  char *error;
  uint lineNumber;
  _func_int **pp_Var11;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_36;
  int local_34;
  
  pOVar10 = instr->m_src1;
  if (pOVar10 == constSrc) {
    pOVar10 = instr->m_src2;
  }
  bVar4 = ValueInfo::TryGetIntConstantValue(valuInfo,&local_34,false);
  if (!bVar4) {
    OVar5 = IR::Opnd::GetKind(constSrc);
    OVar6 = IR::Opnd::GetKind(constSrc);
    if (OVar5 == OpndKindAddr) {
      if (OVar6 != OpndKindAddr) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
        if (!bVar4) goto LAB_00459b4c;
        *puVar9 = 0;
      }
      bVar7 = *(byte *)((long)&constSrc[2].m_valueType.field_0.bits + 1);
      if (((bVar7 != 1) && (bVar7 != 10)) &&
         ((_func_int **)(long)(int)constSrc[2]._vptr_Opnd != constSrc[2]._vptr_Opnd)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x195b,
                           "(addrOpnd->IsVar() || Math::FitsInDWord((size_t)addrOpnd->m_address))",
                           "addrOpnd->IsVar() || Math::FitsInDWord((size_t)addrOpnd->m_address)");
        if (!bVar4) goto LAB_00459b4c;
        *puVar9 = 0;
        bVar7 = *(byte *)((long)&constSrc[2].m_valueType.field_0.bits + 1);
      }
      if ((bVar7 == 10) || (bVar7 == 1)) {
        pp_Var11 = constSrc[2]._vptr_Opnd;
        if (((ulong)pp_Var11 & 0x1ffff00000000) == 0x1000000000000 ||
            ((ulong)pp_Var11 & 0xffff000000000000) != 0x1000000000000) {
          if (((ulong)pp_Var11 & 0xffff000000000000) == 0x1000000000000) goto LAB_004599ce;
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar9 = 1;
          error = "(Is(aValue))";
          message = "Ensure var is actually a \'TaggedInt\'";
          lineNumber = 0x43;
        }
        else {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar9 = 1;
          error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
          message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
          lineNumber = 0x2a;
        }
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
                           ,lineNumber,error,message);
        if (!bVar4) goto LAB_00459b4c;
        *puVar9 = 0;
      }
      else {
        OVar5 = IR::Opnd::GetKind(constSrc);
        if (OVar5 != OpndKindAddr) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar9 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
          if (!bVar4) goto LAB_00459b4c;
          *puVar9 = 0;
        }
        uVar8 = Math::PointerCastToIntegral<int>(constSrc[2]._vptr_Opnd);
        pp_Var11 = (_func_int **)(ulong)uVar8;
      }
LAB_004599ce:
      local_34 = (int)pp_Var11;
    }
    else {
      if (OVar6 != OpndKindIntConst) {
        return false;
      }
      OVar5 = IR::Opnd::GetKind(constSrc);
      if (OVar5 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar4) goto LAB_00459b4c;
        *puVar9 = 0;
      }
      local_34 = IR::IntConstOpnd::AsInt32((IntConstOpnd *)constSrc);
    }
  }
  OVar1 = instr->m_opcode;
  if (OVar1 < Add_I4) {
    if (OVar1 != Add_A) {
      if (OVar1 == Div_A) {
        if (local_34 != 1) {
          return false;
        }
        goto LAB_00459a94;
      }
      if (OVar1 != Mul_A) {
        return false;
      }
      goto switchD_004599fd_caseD_1c2;
    }
    local_36 = (pOVar10->m_valueType).field_0;
    bVar4 = ValueType::IsInt((ValueType *)&local_36.field_0);
    if (!bVar4) {
      return false;
    }
    if (local_34 != 0) {
      return false;
    }
LAB_00459a7f:
    pOVar10 = instr->m_src1;
    if (instr->m_src1 == constSrc) {
      pOVar10 = instr->m_src2;
    }
    goto LAB_00459aa5;
  }
  switch(OVar1) {
  case Add_I4:
    if (local_34 != 0) {
      return false;
    }
    goto LAB_00459a7f;
  default:
    goto switchD_004599fd_caseD_1c1;
  case Mul_I4:
switchD_004599fd_caseD_1c2:
    if (local_34 != 1) {
      return false;
    }
    break;
  case And_I4:
    pOVar3 = pOVar10;
    goto joined_r0x00459a35;
  case Or_I4:
    pOVar3 = constSrc;
    constSrc = pOVar10;
joined_r0x00459a35:
    pOVar10 = pOVar3;
    if ((local_34 != -1) && (pOVar10 = constSrc, local_34 != 0)) {
switchD_004599fd_caseD_1c1:
      return false;
    }
    break;
  case Shl_I4:
  case Shr_I4:
  case ShrU_I4:
    if (local_34 != 0) {
      return false;
    }
LAB_00459a94:
    if (instr->m_src2 != constSrc) {
      return false;
    }
    pOVar10 = instr->m_src1;
  }
LAB_00459aa5:
  CaptureByteCodeSymUses(this,instr);
  if (pOVar10 == instr->m_src1) {
    IR::Instr::FreeSrc2(instr);
  }
  else {
    if (pOVar10 != instr->m_src2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x19e1,"(src == instr->GetSrc2())","src == instr->GetSrc2()");
      if (!bVar4) {
LAB_00459b4c:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar9 = 0;
    }
    pOVar10 = IR::Instr::UnlinkSrc2(instr);
    IR::Instr::ReplaceSrc1(instr,pOVar10);
  }
  instr->m_opcode = Ld_A;
  InvalidateInductionVariables(this,instr);
  return true;
}

Assistant:

bool
GlobOpt::OptConstPeep(IR::Instr *instr, IR::Opnd *constSrc, Value **pDstVal, ValueInfo *valuInfo)
{
    int32 value;
    IR::Opnd *src;
    IR::Opnd *nonConstSrc = (constSrc == instr->GetSrc1() ? instr->GetSrc2() : instr->GetSrc1());

    // Try to find the value from value info first
    if (valuInfo->TryGetIntConstantValue(&value))
    {
    }
    else if (constSrc->IsAddrOpnd())
    {
        IR::AddrOpnd *addrOpnd = constSrc->AsAddrOpnd();
#ifdef _M_X64
        Assert(addrOpnd->IsVar() || Math::FitsInDWord((size_t)addrOpnd->m_address));
#else
        Assert(sizeof(value) == sizeof(addrOpnd->m_address));
#endif

        if (addrOpnd->IsVar())
        {
            value = Js::TaggedInt::ToInt32(addrOpnd->m_address);
        }
        else
        {
            // We asserted that the address will fit in a DWORD above
            value = ::Math::PointerCastToIntegral<int32>(constSrc->AsAddrOpnd()->m_address);
        }
    }
    else if (constSrc->IsIntConstOpnd())
    {
        value = constSrc->AsIntConstOpnd()->AsInt32();
    }
    else
    {
        return false;
    }

    switch(instr->m_opcode)
    {
        // Can't do all Add_A because of string concats.
        // Sub_A cannot be transformed to a NEG_A because 0 - 0 != -0
    case Js::OpCode::Add_A:
        src = nonConstSrc;

        if (!src->GetValueType().IsInt())
        {
            // 0 + -0  != -0
            // "Foo" + 0 != "Foo
            return false;
        }
        // fall-through

    case Js::OpCode::Add_I4:
        if (value != 0)
        {
            return false;
        }
        if (constSrc == instr->GetSrc1())
        {
            src = instr->GetSrc2();
        }
        else
        {
            src = instr->GetSrc1();
        }
        break;

    case Js::OpCode::Mul_A:
    case Js::OpCode::Mul_I4:
        if (value == 0)
        {
            // -0 * 0 != 0
            return false;
        }
        else if (value == 1)
        {
            src = nonConstSrc;
        }
        else
        {
            return false;
        }
        break;

    case Js::OpCode::Div_A:
        if (value == 1 && constSrc == instr->GetSrc2())
        {
            src = instr->GetSrc1();
        }
        else
        {
            return false;
        }
        break;

    case Js::OpCode::Or_I4:
        if (value == -1)
        {
            src = constSrc;
        }
        else if (value == 0)
        {
            src = nonConstSrc;
        }
        else
        {
            return false;
        }
        break;

    case Js::OpCode::And_I4:
        if (value == -1)
        {
            src = nonConstSrc;
        }
        else if (value == 0)
        {
            src = constSrc;
        }
        else
        {
            return false;
        }
        break;

    case Js::OpCode::Shl_I4:
    case Js::OpCode::ShrU_I4:
    case Js::OpCode::Shr_I4:
        if (value != 0 || constSrc != instr->GetSrc2())
        {
            return false;
        }
        src = instr->GetSrc1();
        break;

    default:
        return false;
    }

    this->CaptureByteCodeSymUses(instr);

    if (src == instr->GetSrc1())
    {
        instr->FreeSrc2();
    }
    else
    {
        Assert(src == instr->GetSrc2());
        instr->ReplaceSrc1(instr->UnlinkSrc2());
    }

    instr->m_opcode = Js::OpCode::Ld_A;

    InvalidateInductionVariables(instr);

    return true;
}